

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *next_1;
  xml_node_struct *child;
  xml_attribute_struct *next;
  xml_attribute_struct *attr;
  xml_allocator *alloc_local;
  xml_node_struct *n_local;
  
  if ((n->header & 0x20) != 0) {
    xml_allocator::deallocate_string(alloc,n->name);
  }
  if ((n->header & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,n->value);
  }
  next = n->first_attribute;
  while (next != (xml_attribute_struct *)0x0) {
    pxVar1 = next->next_attribute;
    destroy_attribute(next,alloc);
    next = pxVar1;
  }
  next_1 = n->first_child;
  while (next_1 != (xml_node_struct *)0x0) {
    pxVar2 = next_1->next_sibling;
    destroy_node(next_1,alloc);
    next_1 = pxVar2;
  }
  xml_allocator::deallocate_memory(alloc,n,0x40,(xml_memory_page *)((long)n - (n->header >> 8)));
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		if (n->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(n->name);

		if (n->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), PUGI__GETPAGE(n));
	}